

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrQuerySenseDataAsyncBD
                   (XrSenseDataProviderBD provider,XrSenseDataQueryInfoBD *queryInfo,
                   XrFutureEXT *future)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  GenValidUsageXrInstanceInfo *instance_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  XrSenseDataProviderBD_T *in_stack_fffffffffffffd78;
  string local_280;
  string local_260;
  XrSenseDataProviderBD provider_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_218;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 0x3ba0b988;
  provider_local = provider;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSenseDataProviderBD_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&provider_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrSenseDataProviderBDHandle(&provider_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrSenseDataProviderBD_T_*>::getWithInstanceInfo
                      (&g_sensedataproviderbd_info,provider_local);
    instance_info = pVar3.second;
    if (queryInfo == (XrSenseDataQueryInfoBD *)0x0) {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrQuerySenseDataAsyncBD-queryInfo-parameter",
                 (allocator *)&local_218);
      std::__cxx11::string::string
                ((string *)&local_280,"xrQuerySenseDataAsyncBD",
                 (allocator *)&stack0xfffffffffffffd7f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1c8,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_260,
                 "Invalid NULL for XrSenseDataQueryInfoBD \"queryInfo\" which is not optional and must be non-NULL"
                 ,(allocator *)&stack0xfffffffffffffd7e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1c8,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      this = &local_1c8;
    }
    else {
      std::__cxx11::string::string((string *)&oss,"xrQuerySenseDataAsyncBD",(allocator *)&local_280)
      ;
      XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,queryInfo);
      std::__cxx11::string::~string((string *)&oss);
      if (XVar2 == XR_SUCCESS) {
        XVar2 = XR_SUCCESS;
        if (future != (XrFutureEXT *)0x0) goto LAB_0020f521;
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrQuerySenseDataAsyncBD-future-parameter",
                   (allocator *)&local_218);
        std::__cxx11::string::string
                  ((string *)&local_280,"xrQuerySenseDataAsyncBD",
                   (allocator *)&stack0xfffffffffffffd7f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1f8,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_260,
                   "Invalid NULL for XrFutureEXT \"future\" which is not optional and must be non-NULL"
                   ,(allocator *)&stack0xfffffffffffffd7e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_1f8,&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        this = &local_1f8;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrQuerySenseDataAsyncBD-queryInfo-parameter",
                   (allocator *)&local_218);
        std::__cxx11::string::string
                  ((string *)&local_280,"xrQuerySenseDataAsyncBD",
                   (allocator *)&stack0xfffffffffffffd7f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1e0,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_260,"Command xrQuerySenseDataAsyncBD param queryInfo is invalid"
                   ,(allocator *)&stack0xfffffffffffffd7e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_1e0,&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        this = &local_1e0;
      }
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&oss);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSenseDataProviderBD handle \"provider\" ");
    HandleToHexString<XrSenseDataProviderBD_T*>(in_stack_fffffffffffffd78);
    std::operator<<((ostream *)&oss,(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string
              ((string *)&local_280,"VUID-xrQuerySenseDataAsyncBD-provider-parameter",
               (allocator *)&stack0xfffffffffffffd7f);
    std::__cxx11::string::string
              ((string *)&local_260,"xrQuerySenseDataAsyncBD",(allocator *)&stack0xfffffffffffffd7e)
    ;
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1b0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_280,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_260,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1b0,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1b0);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
  }
LAB_0020f521:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrQuerySenseDataAsyncBD(
XrSenseDataProviderBD provider,
const XrSenseDataQueryInfoBD* queryInfo,
XrFutureEXT* future) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(provider, XR_OBJECT_TYPE_SENSE_DATA_PROVIDER_BD);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSenseDataProviderBDHandle(&provider);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSenseDataProviderBD handle \"provider\" ";
                oss << HandleToHexString(provider);
                CoreValidLogMessage(nullptr, "VUID-xrQuerySenseDataAsyncBD-provider-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQuerySenseDataAsyncBD",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_sensedataproviderbd_info.getWithInstanceInfo(provider);
        GenValidUsageXrHandleInfo *gen_sensedataproviderbd_info = info_with_instance.first;
        (void)gen_sensedataproviderbd_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == queryInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrQuerySenseDataAsyncBD-queryInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQuerySenseDataAsyncBD", objects_info,
                                "Invalid NULL for XrSenseDataQueryInfoBD \"queryInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrSenseDataQueryInfoBD is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrQuerySenseDataAsyncBD", objects_info,
                                                        true, true, queryInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrQuerySenseDataAsyncBD-queryInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQuerySenseDataAsyncBD",
                                objects_info,
                                "Command xrQuerySenseDataAsyncBD param queryInfo is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == future) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrQuerySenseDataAsyncBD-future-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQuerySenseDataAsyncBD", objects_info,
                                "Invalid NULL for XrFutureEXT \"future\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrQuerySenseDataAsyncBD-future-parameter" type
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}